

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XBM_Image.cxx
# Opt level: O0

void __thiscall Fl_XBM_Image::Fl_XBM_Image(Fl_XBM_Image *this,char *name)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uchar *puVar3;
  bool bVar4;
  undefined1 local_85c [4];
  char *pcStack_858;
  uint t;
  char *a;
  int local_848;
  int n;
  int r;
  int i;
  int wh [2];
  char junk [1024];
  char buffer [1024];
  uchar *local_28;
  uchar *ptr;
  FILE *f;
  char *name_local;
  Fl_XBM_Image *this_local;
  
  Fl_Bitmap::Fl_Bitmap(&this->super_Fl_Bitmap,(char *)0x0,0,0);
  (this->super_Fl_Bitmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_XBM_Image_002ee0d8;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    for (n = 0; n < 2; n = n + 1) {
      do {
        pcVar2 = fgets(junk + 0x3f8,0x400,__stream);
        if (pcVar2 == (char *)0x0) {
          fclose(__stream);
          return;
        }
        local_848 = __isoc99_sscanf(junk + 0x3f8,"#define %s %d",wh,&r + n);
      } while (local_848 < 2);
    }
    do {
      pcVar2 = fgets(junk + 0x3f8,0x400,__stream);
      if (pcVar2 == (char *)0x0) {
        fclose(__stream);
        return;
      }
      iVar1 = strncmp(junk + 0x3f8,"static ",7);
    } while (iVar1 != 0);
    Fl_Image::w((Fl_Image *)this,r);
    Fl_Image::h((Fl_Image *)this,i);
    iVar1 = r + 7;
    if (r + 7 < 0) {
      iVar1 = r + 0xe;
    }
    a._4_4_ = (iVar1 >> 3) * i;
    puVar3 = (uchar *)operator_new__((long)a._4_4_);
    (this->super_Fl_Bitmap).array = puVar3;
    n = 0;
    local_28 = (this->super_Fl_Bitmap).array;
    while (n < a._4_4_) {
      pcVar2 = fgets(junk + 0x3f8,0x400,__stream);
      if (pcVar2 == (char *)0x0) {
        fclose(__stream);
        return;
      }
      pcStack_858 = junk + 0x3f8;
      while (*pcStack_858 != '\0' && n < a._4_4_) {
        iVar1 = __isoc99_sscanf(pcStack_858," 0x%x",local_85c);
        if (0 < iVar1) {
          *local_28 = local_85c[0];
          n = n + 1;
          local_28 = local_28 + 1;
        }
        do {
          bVar4 = false;
          if (*pcStack_858 != '\0') {
            bVar4 = *pcStack_858 != ',';
            pcStack_858 = pcStack_858 + 1;
          }
        } while (bVar4);
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

Fl_XBM_Image::Fl_XBM_Image(const char *name) : Fl_Bitmap((const char *)0,0,0) {
  FILE	*f;
  uchar	*ptr;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  char buffer[1024];
  char junk[1024];
  int wh[2]; // width and height
  int i;
  for (i = 0; i<2; i++) {
    for (;;) {
      if (!fgets(buffer,1024,f)) {
        fclose(f);
	return;
      }
      int r = sscanf(buffer,"#define %s %d",junk,&wh[i]);
      if (r >= 2) break;
    }
  }

  // skip to data array:
  for (;;) {
    if (!fgets(buffer,1024,f)) {
      fclose(f);
      return;
    }
    if (!strncmp(buffer,"static ",7)) break;
  }

  // Allocate memory...
  w(wh[0]);
  h(wh[1]);

  int n = ((wh[0]+7)/8)*wh[1];
  array = new uchar[n];

  // read the data:
  for (i = 0, ptr = (uchar *)array; i < n;) {
    if (!fgets(buffer,1024,f)) {
      fclose(f);
      return;
    }
    const char *a = buffer;
    while (*a && i<n) {
      unsigned int t;
      if (sscanf(a," 0x%x",&t)>0) {
        *ptr++ = (uchar)t;
	i ++;
      }
      while (*a && *a++ != ',') {/*empty*/}
    }
  }

  fclose(f);
}